

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

void ihevc_dpb_mgr_reset(dpb_mgr_t *ps_dpb_mgr,buf_mgr_t *ps_buf_mgr)

{
  undefined8 *in_RDI;
  dpb_info_t *ps_dpb_info;
  int i;
  buf_mgr_t *in_stack_ffffffffffffffd8;
  int local_14;
  
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    if (*(char *)(in_RDI[(long)local_14 * 2 + 1] + 0x1c) != '\0') {
      *(undefined1 *)(in_RDI[(long)local_14 * 2 + 1] + 0x1c) = 0;
      in_RDI[(long)local_14 * 2 + 2] = 0;
      ihevc_buf_mgr_release(in_stack_ffffffffffffffd8,0,0x2da351);
      in_RDI[(long)local_14 * 2 + 1] = 0;
    }
  }
  *(undefined1 *)(in_RDI + 0x81) = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void ihevc_dpb_mgr_reset(dpb_mgr_t *ps_dpb_mgr, buf_mgr_t *ps_buf_mgr)
{
    int i;
    dpb_info_t *ps_dpb_info;

    ps_dpb_info = ps_dpb_mgr->as_dpb_info;

    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if(ps_dpb_info[i].ps_pic_buf->u1_used_as_ref)
        {
            ps_dpb_info[i].ps_pic_buf->u1_used_as_ref = UNUSED_FOR_REF;
            ps_dpb_info[i].ps_prev_dpb = NULL;
            //Release physical buffer
            ihevc_buf_mgr_release(ps_buf_mgr, ps_dpb_info[i].ps_pic_buf->u1_buf_id,
                                  BUF_MGR_REF);

            ps_dpb_info[i].ps_pic_buf = NULL;
        }
    }
    ps_dpb_mgr->u1_num_ref_bufs = 0;
    ps_dpb_mgr->ps_dpb_head = NULL;

}